

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferBindingCase::iterate(BufferBindingCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  int ndx;
  GLuint index;
  allocator<char> local_112;
  allocator<char> local_111;
  ScopedLogSection section_1;
  string local_108;
  string local_e8;
  int maxBindings;
  CallLogWrapper gl;
  ScopedLogSection superSection;
  ScopedLogSection section;
  GLuint local_90;
  Buffer bufferB;
  ResultCollector result;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108," // ERROR: ",(allocator<char> *)&local_e8);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  maxBindings = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_numBindingsTarget,&maxBindings);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0xe8);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Initial",(allocator<char> *)&bufferB);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Initial value",(allocator<char> *)&superSection);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  for (iVar2 = 0; iVar2 < maxBindings; iVar2 = iVar2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,this->m_queryTarget,iVar2,0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"AfterSetting",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting",(allocator<char> *)&bufferB);
  tcu::ScopedLogSection::ScopedLogSection(&superSection,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&section,
             ((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&bufferB,((this->super_TestCase).m_context)->m_renderCtx);
  iVar2 = maxBindings;
  index = maxBindings / 2;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Generic",&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting generic binding point",&local_112);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBuffer(&gl,this->m_bufferTarget,local_90);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glBindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0xfc);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,0,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Indexed",&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting with glBindBufferBase",&local_112);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBufferBase(&gl,this->m_bufferTarget,0,local_90);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glBindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x104);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,0,local_90,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Indexed",&local_111);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"After setting with glBindBufferRange",&local_112);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBufferRange
            (&gl,this->m_bufferTarget,index,bufferB.super_ObjectWrapper.m_object,0,8);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glBindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x10c);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,index,bufferB.super_ObjectWrapper.m_object,
             this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  if (2 < iVar2 + 1U) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"DifferentStates",&local_111);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Original state did not change",&local_112);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,this->m_queryTarget,0,local_90,this->m_verifierType);
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&bufferB.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&section);
  tcu::ScopedLogSection::~ScopedLogSection(&superSection);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BufferBindingCase::IterateResult BufferBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxBindings	= -1;

	gl.enableLogging(true);

	gl.glGetIntegerv(m_numBindingsTarget, &maxBindings);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxBindings; ++ndx)
			verifyStateIndexedInteger(result, gl, m_queryTarget, ndx, 0, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSetting", "After setting");
		glu::Buffer					bufferA			(m_context.getRenderContext());
		glu::Buffer					bufferB			(m_context.getRenderContext());
		const int					ndxA			= 0;
		const int					ndxB			= maxBindings / 2;

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "Generic", "After setting generic binding point");

			gl.glBindBuffer(m_bufferTarget, *bufferA);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glBindBuffer");

			verifyStateIndexedInteger(result, gl, m_queryTarget, 0, 0, m_verifierType);
		}
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Indexed", "After setting with glBindBufferBase");

			gl.glBindBufferBase(m_bufferTarget, ndxA, *bufferA);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glBindBufferBase");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxA, *bufferA, m_verifierType);
		}
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Indexed", "After setting with glBindBufferRange");

			gl.glBindBufferRange(m_bufferTarget, ndxB, *bufferB, 0, 8);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glBindBufferRange");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxB, *bufferB, m_verifierType);
		}
		if (ndxA != ndxB)
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "DifferentStates", "Original state did not change");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxA, *bufferA, m_verifierType);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}